

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flow.cpp
# Opt level: O2

void __thiscall CFlow::DbgRender(CFlow *this)

{
  float fVar1;
  float fVar2;
  long lVar3;
  IGraphics *pIVar4;
  int iVar5;
  int iVar6;
  int y;
  int iVar7;
  int x;
  int iVar8;
  long in_FS_OFFSET;
  float fVar9;
  float fVar10;
  CLineItem Array [1024];
  
  Array[0x300].m_X1 = 0.0;
  Array[0x300].m_Y1 = 0.0;
  Array[0x200].m_X1 = 0.0;
  Array[0x200].m_Y1 = 0.0;
  Array[0x100].m_X1 = 0.0;
  Array[0x100].m_Y1 = 0.0;
  Array[0].m_X1 = 0.0;
  Array[0].m_Y1 = 0.0;
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_pCells != (CCell *)0x0) {
    pIVar4 = ((this->super_CComponent).m_pClient)->m_pGraphics;
    (*(pIVar4->super_IInterface)._vptr_IInterface[0x13])(pIVar4,0xffffffffffffffff);
    (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x14])
              ();
    iVar6 = 0;
    for (iVar7 = 0; iVar7 < this->m_Height; iVar7 = iVar7 + 1) {
      for (iVar8 = 0; iVar8 < this->m_Width; iVar8 = iVar8 + 1) {
        fVar9 = (float)(this->m_Spacing * iVar8);
        fVar10 = (float)(this->m_Spacing * iVar7);
        iVar5 = this->m_Width * iVar7 + iVar8;
        fVar1 = this->m_pCells[iVar5].m_Vel.field_0.x;
        fVar2 = this->m_pCells[iVar5].m_Vel.field_1.y;
        iVar5 = iVar6 + 1;
        Array[iVar6].m_X0 = fVar9;
        Array[iVar6].m_Y0 = fVar10;
        Array[iVar6].m_X1 = fVar1 * 0.01 + fVar9;
        Array[iVar6].m_Y1 = fVar2 * 0.01 + fVar10;
        iVar6 = iVar5;
        if (iVar5 == 0x400) {
          pIVar4 = ((this->super_CComponent).m_pClient)->m_pGraphics;
          (*(pIVar4->super_IInterface)._vptr_IInterface[0x16])(pIVar4,Array,0x400);
          iVar6 = 0;
        }
      }
    }
    if (iVar6 != 0) {
      pIVar4 = ((this->super_CComponent).m_pClient)->m_pGraphics;
      (*(pIVar4->super_IInterface)._vptr_IInterface[0x16])(pIVar4,Array);
    }
    (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x15])
              ();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CFlow::DbgRender()
{
	if(!m_pCells)
		return;

	IGraphics::CLineItem Array[1024];
	int NumItems = 0;
	Graphics()->TextureClear();
	Graphics()->LinesBegin();
	for(int y = 0; y < m_Height; y++)
		for(int x = 0; x < m_Width; x++)
		{
			vec2 Pos(x*m_Spacing, y*m_Spacing);
			vec2 Vel = m_pCells[y*m_Width+x].m_Vel * 0.01f;
			Array[NumItems++] = IGraphics::CLineItem(Pos.x, Pos.y, Pos.x+Vel.x, Pos.y+Vel.y);
			if(NumItems == 1024)
			{
				Graphics()->LinesDraw(Array, 1024);
				NumItems = 0;
			}
		}

	if(NumItems)
		Graphics()->LinesDraw(Array, NumItems);
	Graphics()->LinesEnd();
}